

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger number_delegate_tochar(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQString *x;
  SQChar c;
  SQObjectPtr local_20;
  
  pSVar1 = stack_get(v,1);
  if ((pSVar1->super_SQObject)._type == OT_FLOAT) {
    c = (SQChar)(long)(pSVar1->super_SQObject)._unVal.fFloat;
  }
  else {
    c = (SQChar)*(undefined4 *)&(pSVar1->super_SQObject)._unVal;
  }
  x = SQString::Create(v->_sharedstate,&c,1);
  SQObjectPtr::SQObjectPtr(&local_20,x);
  SQVM::Push(v,&local_20);
  SQObjectPtr::~SQObjectPtr(&local_20);
  return 1;
}

Assistant:

static SQInteger number_delegate_tochar(HSQUIRRELVM v)
{
    SQObject &o=stack_get(v,1);
    SQChar c = (SQChar)tointeger(o);
    v->Push(SQString::Create(_ss(v),(const SQChar *)&c,1));
    return 1;
}